

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::IssueMessage(cmMakefile *this,MessageType t,string *text,bool force)

{
  string *text_00;
  MessageType t_00;
  bool bVar1;
  const_reference ppcVar2;
  cmake *pcVar3;
  string local_138;
  cmState *local_118;
  cmLinkedTree<cmState::SnapshotDataType> *pcStack_110;
  PositionType local_108;
  undefined1 local_100 [8];
  cmOutputConverter converter;
  undefined1 local_c0 [8];
  cmListFileContext lfc;
  cmListFileBacktrace local_68;
  byte local_21;
  string *psStack_20;
  bool force_local;
  string *text_local;
  cmMakefile *pcStack_10;
  MessageType t_local;
  cmMakefile *this_local;
  
  local_21 = force;
  psStack_20 = text;
  text_local._4_4_ = t;
  pcStack_10 = this;
  bVar1 = std::vector<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>::empty
                    (&this->ExecutionStatusStack);
  if (bVar1) {
    cmListFileContext::cmListFileContext((cmListFileContext *)local_c0);
    GetExecutionFilePath_abi_cxx11_((string *)&converter.LinkScriptShell,this);
    std::__cxx11::string::operator=
              ((string *)(lfc.Name.field_2._M_local_buf + 8),(string *)&converter.LinkScriptShell);
    std::__cxx11::string::~string((string *)&converter.LinkScriptShell);
    pcVar3 = GetCMakeInstance(this);
    bVar1 = cmake::GetIsInTryCompile(pcVar3);
    if (!bVar1) {
      local_108 = (this->StateSnapshot).Position.Position;
      local_118 = (this->StateSnapshot).State;
      pcStack_110 = (this->StateSnapshot).Position.Tree;
      cmOutputConverter::cmOutputConverter((cmOutputConverter *)local_100,this->StateSnapshot);
      cmOutputConverter::Convert
                (&local_138,(cmOutputConverter *)local_100,(string *)((long)&lfc.Name.field_2 + 8),
                 HOME,UNCHANGED);
      std::__cxx11::string::operator=
                ((string *)(lfc.Name.field_2._M_local_buf + 8),(string *)&local_138);
      std::__cxx11::string::~string((string *)&local_138);
    }
    lfc.FilePath.field_2._8_8_ = 0;
    pcVar3 = GetCMakeInstance(this);
    cmake::IssueMessage(pcVar3,text_local._4_4_,psStack_20,(cmListFileContext *)local_c0,
                        (bool)(local_21 & 1));
    cmListFileContext::~cmListFileContext((cmListFileContext *)local_c0);
  }
  else {
    if ((text_local._4_4_ == FATAL_ERROR) || (text_local._4_4_ == INTERNAL_ERROR)) {
      ppcVar2 = std::vector<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>::back
                          (&this->ExecutionStatusStack);
      cmExecutionStatus::SetNestedError(*ppcVar2,true);
    }
    pcVar3 = GetCMakeInstance(this);
    t_00 = text_local._4_4_;
    text_00 = psStack_20;
    GetBacktrace(&local_68,this);
    cmake::IssueMessage(pcVar3,t_00,text_00,&local_68,(bool)(local_21 & 1));
    cmListFileBacktrace::~cmListFileBacktrace(&local_68);
  }
  return;
}

Assistant:

void cmMakefile::IssueMessage(cmake::MessageType t,
                              std::string const& text,
                              bool force) const
{
  // Collect context information.
  if(!this->ExecutionStatusStack.empty())
    {
    if((t == cmake::FATAL_ERROR) || (t == cmake::INTERNAL_ERROR))
      {
      this->ExecutionStatusStack.back()->SetNestedError(true);
      }
    this->GetCMakeInstance()->IssueMessage(t, text, this->GetBacktrace(),
                                           force);
    }
  else
    {
    cmListFileContext lfc;
    // We are not currently executing a command.  Add whatever context
    // information we have.
    lfc.FilePath = this->GetExecutionFilePath();

    if(!this->GetCMakeInstance()->GetIsInTryCompile())
      {
      cmOutputConverter converter(this->StateSnapshot);
      lfc.FilePath = converter.Convert(lfc.FilePath, cmOutputConverter::HOME);
      }
    lfc.Line = 0;
    this->GetCMakeInstance()->IssueMessage(t, text, lfc, force);
    }
}